

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

ssize_t archive_write_mtree_data(archive_write *a,void *buff,size_t n)

{
  long *plVar1;
  ulong uVar2;
  
  plVar1 = (long *)a->format_data;
  uVar2 = plVar1[0xf];
  if (uVar2 < n) {
    n = uVar2;
  }
  plVar1[0xf] = uVar2 - n;
  if (((*plVar1 != 0) && (*(int *)(*plVar1 + 0xe4) == 0x8000)) &&
     ((*(byte *)(plVar1 + 0x1c) & 1) != 0)) {
    for (uVar2 = 0; n != uVar2; uVar2 = uVar2 + 1) {
      *(uint *)((long)plVar1 + 0xe4) =
           *(uint *)((long)plVar1 + 0xe4) << 8 ^
           crctab[(uint)*(byte *)((long)buff + uVar2) ^ *(uint *)((long)plVar1 + 0xe4) >> 0x18];
    }
    plVar1[0x1d] = plVar1[0x1d] + n;
  }
  return n;
}

Assistant:

static ssize_t
archive_write_mtree_data(struct archive_write *a, const void *buff, size_t n)
{
	struct mtree_writer *mtree= a->format_data;

	if (n > mtree->entry_bytes_remaining)
		n = (size_t)mtree->entry_bytes_remaining;
	mtree->entry_bytes_remaining -= n;

	/* We don't need to compute a regular file sum */
	if (mtree->mtree_entry == NULL)
		return (n);

	if (mtree->mtree_entry->filetype == AE_IFREG)
		sum_update(mtree, buff, n);

	return (n);
}